

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorShowLabel::dragEnterEvent(QColorShowLabel *this,QDragEnterEvent *e)

{
  long in_FS_OFFSET;
  QColor QVar1;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QMimeData::colorData();
  QVar1 = qvariant_cast<QColor>(&local_40);
  ::QVariant::~QVariant(&local_40);
  e[0xc] = (QDragEnterEvent)(QVar1.cspec != Invalid);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShowLabel::dragEnterEvent(QDragEnterEvent *e)
{
    if (qvariant_cast<QColor>(e->mimeData()->colorData()).isValid())
        e->accept();
    else
        e->ignore();
}